

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalStringConcatenate
          (Evaluator *this,Token *op,GCPtr<symbols::Object> *left,GCPtr<symbols::Object> *right)

{
  __type _Var1;
  _Cat _Var2;
  bool value;
  long lVar3;
  StringObject *this_00;
  string *this_01;
  allocator<char> local_c9;
  string rightValue;
  string leftValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar3 = __dynamic_cast(left->addr,&symbols::Object::typeinfo,&symbols::StringObject::typeinfo,0);
  std::__cxx11::string::string
            ((string *)&leftValue,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar3 + 0x10));
  lVar3 = __dynamic_cast(right->addr,&symbols::Object::typeinfo,&symbols::StringObject::typeinfo,0);
  std::__cxx11::string::string
            ((string *)&rightValue,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar3 + 0x10));
  switch(op->Type) {
  case EQ:
    value = std::operator==(&leftValue,&rightValue);
    break;
  case NOT_EQ:
    _Var1 = std::operator==(&leftValue,&rightValue);
    value = !_Var1;
    break;
  case GT:
    _Var2 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                      (&leftValue,&rightValue);
    value = '\0' < _Var2._M_value;
    break;
  case LT:
    _Var2 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                      (&leftValue,&rightValue);
    value = (bool)((byte)_Var2._M_value >> 7);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Unknown Operator: ",&local_c9);
    std::operator+(&local_88,&op->Literal," invalid operation on type string");
    newError(this,&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    this_01 = &local_68;
    goto LAB_0010aef7;
  case PLUS:
    this_00 = (StringObject *)operator_new(0x38);
    std::operator+(&local_48,&leftValue,&rightValue);
    symbols::StringObject::StringObject(this_00,&local_48);
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_00);
    this_01 = &local_48;
LAB_0010aef7:
    std::__cxx11::string::~string((string *)this_01);
    goto LAB_0010aefc;
  }
  nativeBooleanObject(this,value);
LAB_0010aefc:
  std::__cxx11::string::~string((string *)&rightValue);
  std::__cxx11::string::~string((string *)&leftValue);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalStringConcatenate(Token& op, GCPtr<Object> left, GCPtr<Object> right){
    auto leftValue = dynamic_cast<StringObject*>(left.raw())->value;
    auto rightValue = dynamic_cast<StringObject*>(right.raw())->value;
    switch (op.Type) {
    case TokenType::PLUS:
    {
        return new StringObject(leftValue + rightValue);
    }
    case TokenType::EQ:
        return nativeBooleanObject(leftValue  == rightValue);
    case TokenType::NOT_EQ:
        return nativeBooleanObject(leftValue  != rightValue);
    case TokenType::LT:
        return nativeBooleanObject(leftValue  < rightValue);
    case TokenType::GT:
        return nativeBooleanObject(leftValue  > rightValue);
    default:
        return newError("Unknown Operator: ", op.Literal + " invalid operation on type string");
    }
}